

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Joint.h
# Opt level: O0

bool __thiscall RigidBodyDynamics::Joint::validate_spatial_axis(Joint *this,SpatialVector *axis)

{
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_00;
  DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *this_01;
  ostream *poVar1;
  Vector3_t *in_RSI;
  RealScalar RVar2;
  Vector3d translation;
  Vector3d rotation;
  bool axis_translational;
  bool axis_rotational;
  Index in_stack_ffffffffffffff98;
  DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *in_stack_ffffffffffffffa0;
  double *in_stack_ffffffffffffffd8;
  double *in_stack_ffffffffffffffe0;
  undefined6 in_stack_ffffffffffffffe8;
  byte bVar3;
  byte bVar4;
  
  bVar4 = 0;
  bVar3 = 0;
  this_00 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
            Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                      (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  this_01 = (DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
            Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                      (in_stack_ffffffffffffffa0,(Index)this_00);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
            (this_01,(Index)this_00);
  Vector3_t::Vector3_t
            (in_RSI,(double *)CONCAT17(bVar4,CONCAT16(bVar3,in_stack_ffffffffffffffe8)),
             in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
            (this_01,(Index)this_00);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
            (this_01,(Index)this_00);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
            (this_01,(Index)this_00);
  Vector3_t::Vector3_t
            (in_RSI,(double *)CONCAT17(bVar4,CONCAT16(bVar3,in_stack_ffffffffffffffe8)),
             in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  RVar2 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(this_00);
  if (1e-08 < ABS(RVar2)) {
    bVar4 = 1;
  }
  RVar2 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(this_00);
  if (1e-08 < ABS(RVar2)) {
    bVar3 = 1;
  }
  if ((bVar4 & 1) != 0) {
    RVar2 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(this_00);
    if (1e-08 < RVar2 - 1.0) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"Warning: joint rotation axis is not unit!");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
  }
  if ((bVar3 & 1) != 0) {
    RVar2 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(this_00);
    if (1e-08 < RVar2 - 1.0) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"Warning: joint translation axis is not unit!")
      ;
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
  }
  return (bVar4 & 1) != (bVar3 & 1);
}

Assistant:

bool validate_spatial_axis (Math::SpatialVector &axis)
  {
#ifdef RBDL_USE_CASADI_MATH
      // If using casadi, the axes won't be validated
      return true;
#else
    bool axis_rotational = false;
    bool axis_translational = false;

    Math::Vector3d rotation (axis[0], axis[1], axis[2]);
    Math::Vector3d translation (axis[3], axis[4], axis[5]);

    if (fabs(rotation.norm()) > 1.0e-8) {
      axis_rotational = true;
    }

    if (fabs(translation.norm()) > 1.0e-8) {
      axis_translational = true;
    }

    if(axis_rotational && rotation.norm() - 1.0 > 1.0e-8) {
      std::cerr << "Warning: joint rotation axis is not unit!" << std::endl;
    }

    if(axis_translational && translation.norm() - 1.0 > 1.0e-8) {
      std::cerr << "Warning: joint translation axis is not unit!" << std::endl;
    }

    return axis_rotational != axis_translational;
#endif
  }